

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O0

bool private_ACUtils_ADynArray_shrinkToFit(void *dynArray,size_t typeSize)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  long local_40;
  size_t capacityBackup;
  private_ACUtils_DynArray_Prototype *prototype;
  size_t typeSize_local;
  void *dynArray_local;
  
  if ((dynArray != (void *)0x0) && (*(long *)((long)dynArray + 0x10) != 0)) {
    uVar1 = *(ulong *)((long)dynArray + 0x20);
    uVar4 = (**(code **)((long)dynArray + 0x10))(*(undefined8 *)((long)dynArray + 0x18),typeSize);
    if (uVar1 <= uVar4) {
      return true;
    }
    uVar2 = *(undefined8 *)((long)dynArray + 0x20);
    if (*(long *)((long)dynArray + 0x18) == 0) {
      local_40 = 0;
    }
    else {
      local_40 = *(long *)((long)dynArray + 0x18) + -1;
    }
    *(long *)((long)dynArray + 0x20) = local_40;
    bVar3 = private_ACUtils_ADynArray_reserve
                      (dynArray,*(long *)((long)dynArray + 0x20) + 1,true,typeSize);
    if (bVar3 != false) {
      return true;
    }
    *(undefined8 *)((long)dynArray + 0x20) = uVar2;
  }
  return false;
}

Assistant:

ACUTILS_HD_FUNC bool private_ACUtils_ADynArray_shrinkToFit(void *dynArray, size_t typeSize)
{
    if(dynArray != NULL) {
        struct private_ACUtils_DynArray_Prototype* prototype = (struct private_ACUtils_DynArray_Prototype*) dynArray;
        if(prototype->growStrategy != NULL) {
            if(prototype->capacity > prototype->growStrategy(prototype->size, typeSize)) {
                size_t capacityBackup = prototype->capacity;
                prototype->capacity = (prototype->size == 0) ? 0 : prototype->size - 1;
                if(!private_ACUtils_ADynArray_reserve(dynArray, prototype->capacity + 1, true, typeSize)) {
                    prototype->capacity = capacityBackup;
                } else {
                    return true;
                }
            } else {
                return true;
            }
        }
    }
    return false;
}